

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slghpattern.cc
# Opt level: O2

Pattern * __thiscall
InstructionPattern::commonSubPattern(InstructionPattern *this,Pattern *b,int4 sa)

{
  int iVar1;
  long lVar2;
  undefined4 extraout_var;
  InstructionPattern *this_00;
  PatternBlock *this_01;
  undefined4 extraout_var_01;
  PatternBlock *pPVar3;
  pointer_____offset_0x10___ *__fn;
  void *in_R8;
  PatternBlock *this_02;
  undefined1 auVar4 [16];
  undefined4 extraout_var_00;
  
  iVar1 = (*b->_vptr_Pattern[8])(b);
  if (iVar1 < 1) {
    lVar2 = __dynamic_cast(b,&Pattern::typeinfo,&CombinePattern::typeinfo);
    if (lVar2 == 0) {
      __fn = &Pattern::typeinfo;
      iVar1 = 0;
      auVar4 = __dynamic_cast(b,&Pattern::typeinfo,&ContextPattern::typeinfo);
      if (auVar4._0_8_ == 0) {
        if (sa < 0) {
          iVar1 = PatternBlock::clone(this->maskvalue,(__fn *)__fn,auVar4._8_8_,iVar1,in_R8);
          pPVar3 = (PatternBlock *)CONCAT44(extraout_var_01,iVar1);
          PatternBlock::shift(pPVar3,-sa);
          this_01 = (PatternBlock *)b[1]._vptr_Pattern;
          this_02 = pPVar3;
        }
        else {
          iVar1 = PatternBlock::clone((PatternBlock *)b[1]._vptr_Pattern,(__fn *)__fn,auVar4._8_8_,
                                      iVar1,in_R8);
          this_01 = (PatternBlock *)CONCAT44(extraout_var_00,iVar1);
          PatternBlock::shift(this_01,sa);
          pPVar3 = this->maskvalue;
          this_02 = this_01;
        }
        pPVar3 = PatternBlock::commonSubPattern(pPVar3,this_01);
        PatternBlock::~PatternBlock(this_02);
        operator_delete(this_02);
        this_00 = (InstructionPattern *)operator_new(0x10);
        (this_00->super_DisjointPattern).super_Pattern._vptr_Pattern =
             (_func_int **)&PTR__InstructionPattern_00401318;
        this_00->maskvalue = pPVar3;
      }
      else {
        this_00 = (InstructionPattern *)operator_new(0x10);
        InstructionPattern(this_00,true);
      }
      return (Pattern *)this_00;
    }
  }
  iVar1 = (*b->_vptr_Pattern[6])(b,this,(ulong)(uint)-sa);
  return (Pattern *)CONCAT44(extraout_var,iVar1);
}

Assistant:

Pattern *InstructionPattern::commonSubPattern(const Pattern *b,int4 sa) const

{
  if (b->numDisjoint()>0)
    return b->commonSubPattern(this,-sa);

  const CombinePattern *b2 = dynamic_cast<const CombinePattern *>(b);
  if (b2 != (const CombinePattern *)0)
    return b->commonSubPattern(this,-sa);

  const ContextPattern *b3 = dynamic_cast<const ContextPattern *>(b);
  if (b3 != (const ContextPattern *)0) {
    InstructionPattern *res = new InstructionPattern(true);
    return res;
  }
  const InstructionPattern *b4 = (const InstructionPattern *)b;
  
  PatternBlock *respattern;
  if (sa < 0) {
    PatternBlock *a = maskvalue->clone();
    a->shift(-sa);
    respattern = a->commonSubPattern(b4->maskvalue);
    delete a;
  }
  else {
    PatternBlock *c = b4->maskvalue->clone();
    c->shift(sa);
    respattern = maskvalue->commonSubPattern(c);
    delete c;
  }
  return new InstructionPattern(respattern);
}